

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.h
# Opt level: O0

RegSlot __thiscall
Js::AsmJSByteCodeGenerator::GetAndReleaseUnaryLocations<float>
          (AsmJSByteCodeGenerator *this,EmitExpressionInfo *rhs)

{
  bool bVar1;
  RegSlot local_1c;
  RegSlot tmpRegToUse;
  EmitExpressionInfo *rhs_local;
  AsmJSByteCodeGenerator *this_local;
  
  bVar1 = AsmJsFunc::IsTmpLocation<float>(this->mFunction,rhs);
  if (bVar1) {
    local_1c = (rhs->super_EmitInfoBase).location;
  }
  else {
    local_1c = AsmJsFunc::AcquireTmpRegister<float>(this->mFunction);
    AsmJsFunc::ReleaseLocation<float>(this->mFunction,rhs);
  }
  return local_1c;
}

Assistant:

RegSlot GetAndReleaseUnaryLocations( const EmitExpressionInfo* rhs )
        {
            RegSlot tmpRegToUse;
            if( mFunction->IsTmpLocation<T>( rhs ) )
            {
                tmpRegToUse = rhs->location;
            }
            else
            {
                tmpRegToUse = mFunction->AcquireTmpRegister<T>();
                mFunction->ReleaseLocation<T>( rhs );
            }
            return tmpRegToUse;
        }